

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,long pos,size_t branchIndex,StringTree *first,
          NoInfer<kj::StringTree> *rest,NoInfer<kj::ArrayPtr<const_char>_> *rest_1,
          NoInfer<kj::String> *rest_2,NoInfer<kj::ArrayPtr<const_char>_> *rest_3,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_4,NoInfer<kj::ArrayPtr<const_char>_> *rest_5,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_6,NoInfer<kj::ArrayPtr<const_char>_> *rest_7,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_8,NoInfer<kj::ArrayPtr<const_char>_> *rest_9,
          NoInfer<kj::String> *rest_10,NoInfer<kj::ArrayPtr<const_char>_> *rest_11,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_12,NoInfer<kj::ArrayPtr<const_char>_> *rest_13
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_14,NoInfer<kj::ArrayPtr<const_char>_> *rest_15,
          NoInfer<kj::StringTree> *rest_16,NoInfer<kj::ArrayPtr<const_char>_> *rest_17,
          NoInfer<kj::String> *rest_18,NoInfer<kj::ArrayPtr<const_char>_> *rest_19,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_20,NoInfer<kj::ArrayPtr<const_char>_> *rest_21,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_22,NoInfer<kj::ArrayPtr<const_char>_> *rest_23,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_24,NoInfer<kj::ArrayPtr<const_char>_> *rest_25,
          NoInfer<kj::String> *rest_26,NoInfer<kj::ArrayPtr<const_char>_> *rest_27,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_28,NoInfer<kj::ArrayPtr<const_char>_> *rest_29
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_30,NoInfer<kj::ArrayPtr<const_char>_> *rest_31,
          NoInfer<kj::StringTree> *rest_32,NoInfer<kj::StringTree> *rest_33,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_34,NoInfer<kj::ArrayPtr<const_char>_> *rest_35,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_36,NoInfer<kj::ArrayPtr<const_char>_> *rest_37,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_38,NoInfer<kj::ArrayPtr<const_char>_> *rest_39,
          NoInfer<kj::String> *rest_40,NoInfer<kj::ArrayPtr<const_char>_> *rest_41,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_42,NoInfer<kj::ArrayPtr<const_char>_> *rest_43,
          NoInfer<kj::String> *rest_44,NoInfer<kj::ArrayPtr<const_char>_> *rest_45,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_46,NoInfer<kj::ArrayPtr<const_char>_> *rest_47
          ,NoInfer<kj::StringTree> *rest_48,NoInfer<kj::StringTree> *rest_49,
          NoInfer<kj::StringTree> *rest_50,NoInfer<kj::StringTree> *rest_51,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_52,NoInfer<kj::ArrayPtr<const_char>_> *rest_53,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_54,NoInfer<kj::ArrayPtr<const_char>_> *rest_55,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_56,NoInfer<kj::ArrayPtr<const_char>_> *rest_57,
          NoInfer<kj::String> *rest_58,NoInfer<kj::ArrayPtr<const_char>_> *rest_59,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_60,NoInfer<kj::ArrayPtr<const_char>_> *rest_61,
          NoInfer<kj::String> *rest_62,NoInfer<kj::ArrayPtr<const_char>_> *rest_63)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  ArrayPtr<const_char> *pAVar4;
  String *pSVar5;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  ArrayPtr<const_char> *pAVar11;
  ArrayPtr<const_char> *pAVar12;
  String *pSVar13;
  ArrayPtr<const_char> *pAVar14;
  CappedArray<char,_14UL> *pCVar15;
  ArrayPtr<const_char> *pAVar16;
  ArrayPtr<const_char> *pAVar17;
  ArrayPtr<const_char> *pAVar18;
  StringTree *pSVar19;
  ArrayPtr<const_char> *pAVar20;
  String *pSVar21;
  ArrayPtr<const_char> *pAVar22;
  ArrayPtr<const_char> *pAVar23;
  ArrayPtr<const_char> *pAVar24;
  ArrayPtr<const_char> *pAVar25;
  ArrayPtr<const_char> *pAVar26;
  ArrayPtr<const_char> *pAVar27;
  ArrayPtr<const_char> *pAVar28;
  String *pSVar29;
  ArrayPtr<const_char> *pAVar30;
  CappedArray<char,_14UL> *pCVar31;
  ArrayPtr<const_char> *pAVar32;
  ArrayPtr<const_char> *pAVar33;
  ArrayPtr<const_char> *pAVar34;
  StringTree *pSVar35;
  StringTree *pSVar36;
  ArrayPtr<const_char> *pAVar37;
  ArrayPtr<const_char> *pAVar38;
  ArrayPtr<const_char> *pAVar39;
  ArrayPtr<const_char> *pAVar40;
  ArrayPtr<const_char> *pAVar41;
  ArrayPtr<const_char> *pAVar42;
  String *pSVar43;
  ArrayPtr<const_char> *pAVar44;
  ArrayPtr<const_char> *pAVar45;
  ArrayPtr<const_char> *pAVar46;
  String *pSVar47;
  ArrayPtr<const_char> *pAVar48;
  CappedArray<char,_14UL> *pCVar49;
  ArrayPtr<const_char> *pAVar50;
  StringTree *pSVar51;
  StringTree *pSVar52;
  StringTree *pSVar53;
  StringTree *pSVar54;
  ArrayPtr<const_char> *pAVar55;
  ArrayPtr<const_char> *pAVar56;
  ArrayPtr<const_char> *pAVar57;
  ArrayPtr<const_char> *pAVar58;
  ArrayPtr<const_char> *pAVar59;
  ArrayPtr<const_char> *pAVar60;
  String *pSVar61;
  ArrayPtr<const_char> *pAVar62;
  ArrayPtr<const_char> *pAVar63;
  ArrayPtr<const_char> *pAVar64;
  String *pSVar65;
  ArrayPtr<const_char> *pAVar66;
  CappedArray<char,_14UL> *pCVar67;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_000001f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000200;
  NoInfer<kj::StringTree> *in_stack_00000208;
  NoInfer<kj::StringTree> *in_stack_00000210;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000218;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000220;
  NoInfer<kj::String> *in_stack_00000228;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000230;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000238;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000240;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000248;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000250;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000258;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000260;
  NoInfer<kj::String> *in_stack_00000268;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000270;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000278;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000280;
  NoInfer<kj::StringTree> *in_stack_00000288;
  NoInfer<kj::StringTree> *in_stack_00000290;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000298;
  ArrayPtr<const_char> *rest_local_1;
  StringTree *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  pSVar3 = fwd<kj::StringTree>(rest);
  pAVar4 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  pSVar5 = fwd<kj::String>(rest_2);
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  pAVar11 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  pAVar12 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  pSVar13 = fwd<kj::String>(rest_10);
  pAVar14 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  pCVar15 = fwd<kj::CappedArray<char,14ul>>(rest_12);
  pAVar16 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  pAVar18 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pSVar19 = fwd<kj::StringTree>(rest_16);
  pAVar20 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  pSVar21 = fwd<kj::String>(rest_18);
  pAVar22 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  pAVar23 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  pAVar24 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  pAVar25 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  pAVar26 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  pAVar27 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  pAVar28 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  pSVar29 = fwd<kj::String>(rest_26);
  pAVar30 = fwd<kj::ArrayPtr<char_const>>(rest_27);
  pCVar31 = fwd<kj::CappedArray<char,14ul>>(rest_28);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  pAVar33 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pAVar34 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  pSVar35 = fwd<kj::StringTree>(rest_32);
  pSVar36 = fwd<kj::StringTree>(rest_33);
  pAVar37 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  pAVar38 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  pAVar39 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  pAVar40 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  pAVar41 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  pAVar42 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pSVar43 = fwd<kj::String>(rest_40);
  pAVar44 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  pAVar45 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  pAVar46 = fwd<kj::ArrayPtr<char_const>>(rest_43);
  pSVar47 = fwd<kj::String>(rest_44);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  pCVar49 = fwd<kj::CappedArray<char,14ul>>(rest_46);
  pAVar50 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  pSVar51 = fwd<kj::StringTree>(rest_48);
  pSVar52 = fwd<kj::StringTree>(rest_49);
  pSVar53 = fwd<kj::StringTree>(rest_50);
  pSVar54 = fwd<kj::StringTree>(rest_51);
  pAVar55 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pAVar57 = fwd<kj::ArrayPtr<char_const>>(rest_54);
  pAVar58 = fwd<kj::ArrayPtr<char_const>>(rest_55);
  pAVar59 = fwd<kj::ArrayPtr<char_const>>(rest_56);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_57);
  pSVar61 = fwd<kj::String>(rest_58);
  pAVar62 = fwd<kj::ArrayPtr<char_const>>(rest_59);
  pAVar63 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  pAVar64 = fwd<kj::ArrayPtr<char_const>>(rest_61);
  pSVar65 = fwd<kj::String>(rest_62);
  pAVar66 = fwd<kj::ArrayPtr<char_const>>(rest_63);
  pCVar67 = fwd<kj::CappedArray<char,14ul>>(in_stack_000001f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  fwd<kj::StringTree>(in_stack_00000208);
  fwd<kj::StringTree>(in_stack_00000210);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000218);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000220);
  fwd<kj::String>(in_stack_00000228);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000248);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000250);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000258);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000260);
  fwd<kj::String>(in_stack_00000268);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000270);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000278);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000280);
  fwd<kj::StringTree>(in_stack_00000288);
  fwd<kj::StringTree>(in_stack_00000290);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000298);
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,pSVar3,pAVar4,pSVar5,pAVar6,pAVar7,pAVar8,pAVar9,pAVar10,
             pAVar11,pAVar12,pSVar13,pAVar14,pCVar15,pAVar16,pAVar17,pAVar18,pSVar19,pAVar20,pSVar21
             ,pAVar22,pAVar23,pAVar24,pAVar25,pAVar26,pAVar27,pAVar28,pSVar29,pAVar30,pCVar31,
             pAVar32,pAVar33,pAVar34,pSVar35,pSVar36,pAVar37,pAVar38,pAVar39,pAVar40,pAVar41,pAVar42
             ,pSVar43,pAVar44,pAVar45,pAVar46,pSVar47,pAVar48,pCVar49,pAVar50,pSVar51,pSVar52,
             pSVar53,pSVar54,pAVar55,pAVar56,pAVar57,pAVar58,pAVar59,pAVar60,pSVar61,pAVar62,pAVar63
             ,pAVar64,pSVar65,pAVar66,pCVar67);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}